

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_prepare_v3(sqlite3 *db,char *zSql,int nBytes,uint prepFlags,sqlite3_stmt **ppStmt,
                      char **pzTail)

{
  int iVar1;
  u32 in_ECX;
  int in_EDX;
  char *in_RSI;
  sqlite3 *in_RDI;
  Vdbe *in_R8;
  sqlite3_stmt **in_R9;
  int rc;
  
  iVar1 = sqlite3LockAndPrepare(in_RDI,in_RSI,in_EDX,in_ECX,in_R8,in_R9,pzTail);
  return iVar1;
}

Assistant:

SQLITE_API int sqlite3_prepare_v3(
  sqlite3 *db,              /* Database handle. */
  const char *zSql,         /* UTF-8 encoded SQL statement. */
  int nBytes,               /* Length of zSql in bytes. */
  unsigned int prepFlags,   /* Zero or more SQLITE_PREPARE_* flags */
  sqlite3_stmt **ppStmt,    /* OUT: A pointer to the prepared statement */
  const char **pzTail       /* OUT: End of parsed string */
){
  int rc;
  /* EVIDENCE-OF: R-56861-42673 sqlite3_prepare_v3() differs from
  ** sqlite3_prepare_v2() only in having the extra prepFlags parameter,
  ** which is a bit array consisting of zero or more of the
  ** SQLITE_PREPARE_* flags.
  **
  ** Proof by comparison to the implementation of sqlite3_prepare_v2()
  ** directly above. */
  rc = sqlite3LockAndPrepare(db,zSql,nBytes,
                 SQLITE_PREPARE_SAVESQL|(prepFlags&SQLITE_PREPARE_MASK),
                 0,ppStmt,pzTail);
  assert( rc==SQLITE_OK || ppStmt==0 || *ppStmt==0 );
  return rc;
}